

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O3

void testMinMaxEigenValue<Imath_2_5::Matrix44<double>>(Matrix44<double> *A)

{
  size_t i;
  long lVar1;
  double (*padVar2) [4];
  size_t j;
  long lVar3;
  double dVar4;
  double dVar5;
  Matrix44<double> V;
  Matrix44<double> U;
  TV maxV;
  TV minV;
  TV S;
  Matrix44<double> local_258;
  Matrix44<double> local_1d8;
  Vec4<double> local_158;
  Vec4<double> local_138;
  Matrix44<double> local_118;
  Matrix44<double> local_98;
  
  local_1d8.x[1][2] = 0.0;
  local_1d8.x[2][1] = 0.0;
  local_1d8.x[3][1] = 0.0;
  local_1d8.x[3][2] = 0.0;
  local_1d8.x[2][3] = 0.0;
  local_1d8.x[3][0] = 0.0;
  local_1d8.x[1][3] = 0.0;
  local_1d8.x[2][0] = 0.0;
  local_1d8.x[0][3] = 0.0;
  local_1d8.x[1][0] = 0.0;
  local_1d8.x[0][1] = 0.0;
  local_1d8.x[0][2] = 0.0;
  local_1d8.x[0][0] = 1.0;
  local_1d8.x[1][1] = 1.0;
  local_1d8.x[2][2] = 1.0;
  local_1d8.x[3][3] = 1.0;
  local_258.x[1][2] = 0.0;
  local_258.x[2][1] = 0.0;
  local_258.x[3][1] = 0.0;
  local_258.x[3][2] = 0.0;
  local_258.x[2][3] = 0.0;
  local_258.x[3][0] = 0.0;
  local_258.x[1][3] = 0.0;
  local_258.x[2][0] = 0.0;
  local_258.x[0][3] = 0.0;
  local_258.x[1][0] = 0.0;
  local_258.x[0][1] = 0.0;
  local_258.x[0][2] = 0.0;
  local_258.x[0][0] = 1.0;
  local_258.x[1][1] = 1.0;
  local_258.x[2][2] = 1.0;
  local_258.x[3][3] = 1.0;
  dVar5 = 0.0;
  lVar1 = 0;
  padVar2 = (double (*) [4])A;
  do {
    lVar3 = 0;
    dVar4 = dVar5;
    do {
      dVar5 = ABS((*(double (*) [4])*padVar2)[lVar3]);
      if (dVar5 <= dVar4) {
        dVar5 = dVar4;
      }
      lVar3 = lVar3 + 1;
      dVar4 = dVar5;
    } while (lVar3 != 4);
    lVar1 = lVar1 + 1;
    padVar2 = padVar2 + 1;
  } while (lVar1 != 4);
  dVar4 = 2.220446049250313e-16;
  if (2.220446049250313e-16 <= dVar5) {
    dVar4 = dVar5;
  }
  dVar5 = dVar4 * 100.0 * 2.220446049250313e-16;
  local_98.x[0][0] = A->x[0][0];
  local_98.x[0][1] = A->x[0][1];
  local_98.x[0][2] = A->x[0][2];
  local_98.x[0][3] = A->x[0][3];
  local_98.x[1][0] = A->x[1][0];
  local_98.x[1][1] = A->x[1][1];
  local_98.x[1][2] = A->x[1][2];
  local_98.x[1][3] = A->x[1][3];
  local_98.x[2][0] = A->x[2][0];
  local_98.x[2][1] = A->x[2][1];
  local_98.x[2][2] = A->x[2][2];
  local_98.x[2][3] = A->x[2][3];
  local_98.x[3][0] = A->x[3][0];
  local_98.x[3][1] = A->x[3][1];
  local_98.x[3][2] = A->x[3][2];
  local_98.x[3][3] = A->x[3][3];
  Imath_2_5::minEigenVector<Imath_2_5::Matrix44<double>,Imath_2_5::Vec4<double>>
            (&local_98,&local_138);
  local_118.x[0][0] = A->x[0][0];
  local_118.x[0][1] = A->x[0][1];
  local_118.x[0][2] = A->x[0][2];
  local_118.x[0][3] = A->x[0][3];
  local_118.x[1][0] = A->x[1][0];
  local_118.x[1][1] = A->x[1][1];
  local_118.x[1][2] = A->x[1][2];
  local_118.x[1][3] = A->x[1][3];
  local_118.x[2][0] = A->x[2][0];
  local_118.x[2][1] = A->x[2][1];
  local_118.x[2][2] = A->x[2][2];
  local_118.x[2][3] = A->x[2][3];
  local_118.x[3][0] = A->x[3][0];
  local_118.x[3][1] = A->x[3][1];
  local_118.x[3][2] = A->x[3][2];
  local_118.x[3][3] = A->x[3][3];
  Imath_2_5::maxEigenVector<Imath_2_5::Matrix44<double>,Imath_2_5::Vec4<double>>
            (&local_118,&local_158);
  local_98.x[0][0] = A->x[0][0];
  local_98.x[0][1] = A->x[0][1];
  local_98.x[0][2] = A->x[0][2];
  local_98.x[0][3] = A->x[0][3];
  local_98.x[1][0] = A->x[1][0];
  local_98.x[1][1] = A->x[1][1];
  local_98.x[1][2] = A->x[1][2];
  local_98.x[1][3] = A->x[1][3];
  local_98.x[2][0] = A->x[2][0];
  local_98.x[2][1] = A->x[2][1];
  local_98.x[2][2] = A->x[2][2];
  local_98.x[2][3] = A->x[2][3];
  local_98.x[3][0] = A->x[3][0];
  local_98.x[3][1] = A->x[3][1];
  local_98.x[3][2] = A->x[3][2];
  local_98.x[3][3] = A->x[3][3];
  lVar1 = 0;
  Imath_2_5::jacobiSVD<double>
            (&local_98,&local_1d8,(Vec4<double> *)&local_118,&local_258,2.220446049250313e-16,false)
  ;
  while( true ) {
    if (dVar5 <= ABS(*(double *)((long)&local_138.x + lVar1) -
                     *(double *)((long)local_258.x[0] + lVar1 * 4 + 0x18))) {
      __assert_fail("abs(minV[i]-V[i][dim - 1]) < threshold",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                    ,0xba,"void testMinMaxEigenValue(const TM &) [TM = Imath_2_5::Matrix44<double>]"
                   );
    }
    if (dVar5 <= ABS(*(double *)((long)&local_158.x + lVar1) -
                     *(double *)((long)local_258.x[0] + lVar1 * 4))) break;
    lVar1 = lVar1 + 8;
    if (lVar1 == 0x20) {
      return;
    }
  }
  __assert_fail("abs(maxV[i]-V[i][0]) < threshold",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                ,0xbb,"void testMinMaxEigenValue(const TM &) [TM = Imath_2_5::Matrix44<double>]");
}

Assistant:

void
testMinMaxEigenValue(const TM& A)
{
  typedef typename TM::BaseVecType TV;
  typedef typename TM::BaseType T;

  TV minV, maxV, S;
  TM U, V;
  
  const T threshold = computeThreshold(A);

  {
      TM A1(A);
      minEigenVector(A1, minV);
      TM A2(A);
      maxEigenVector(A2, maxV);
  }
  {
      TM A3(A);
      jacobiSVD(A3, U, S, V);
  }

  const int dim = TM::dimensions();

  for(int i = 0; i < dim; ++i) {
      assert(abs(minV[i]-V[i][dim - 1]) < threshold);
      assert(abs(maxV[i]-V[i][0]) < threshold);
  }
}